

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_fx_add(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t lab;
  operand local_c0;
  operation local_bc;
  operand local_b8 [2];
  operation local_b0;
  operand local_ac [2];
  operation local_a4 [3];
  operand local_98 [2];
  operation local_90 [3];
  operand local_84 [2];
  operation local_7c [3];
  operand local_70 [2];
  operation local_68 [4];
  string local_58;
  undefined1 local_38 [8];
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  error.field_2._8_8_ = ops;
  std::__cxx11::string::string((string *)local_38);
  this = label;
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_58,this,lab);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_68[0] = CMP;
    local_70[1] = 0x14;
    local_70[0] = NUMBER;
    local_7c[2] = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_68,local_70 + 1,local_70,(int *)(local_7c + 2));
    local_7c[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_7c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_7c[0] = TEST;
    local_84[1] = 0xb;
    local_84[0] = NUMBER;
    local_90[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_7c,local_84 + 1,local_84,(int *)(local_90 + 2));
    local_90[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_90 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_90[0] = TEST;
    local_98[1] = 0xc;
    local_98[0] = NUMBER;
    local_a4[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,local_90,local_98 + 1,local_98,(int *)(local_a4 + 2));
    local_a4[1] = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_a4 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  local_a4[0] = MOV;
  local_ac[1] = 9;
  local_ac[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_a4,local_ac + 1,local_ac);
  local_b0 = ADD;
  local_b8[1] = 9;
  local_b8[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_b0,local_b8 + 1,local_b8);
  local_bc = JMP;
  local_c0 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_bc,&local_c0);
  if ((*(byte *)(error.field_2._8_8_ + 0x1d) & 1) != 0) {
    error_label(code,(string *)local_38,re_fx_add_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_fx_add(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    code.add(asmcode::TEST, asmcode::RDX, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::RDX);
  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_fx_add_contract_violation);
    }
  }